

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

void libcellml::generateEquivalenceMap
               (ComponentPtr *component,EquivalenceMap *map,IndexStack *indexStack)

{
  pointer *ppuVar1;
  size_t sVar2;
  ulong uVar3;
  ComponentPtr c;
  ulong local_48;
  ComponentEntity local_40;
  
  uVar3 = 0;
  while( true ) {
    local_48 = uVar3;
    sVar2 = ComponentEntity::componentCount
                      (&((component->
                         super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr)->super_ComponentEntity);
    if (sVar2 <= uVar3) break;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(indexStack,&local_48);
    ComponentEntity::component
              (&local_40,
               (size_t)(component->
                       super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
    ;
    recordVariableEquivalences((ComponentPtr *)&local_40,map,indexStack);
    generateEquivalenceMap((ComponentPtr *)&local_40,map,indexStack);
    ppuVar1 = &(indexStack->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_finish;
    *ppuVar1 = *ppuVar1 + -1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &local_40.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
    uVar3 = local_48 + 1;
  }
  return;
}

Assistant:

void generateEquivalenceMap(const ComponentPtr &component, EquivalenceMap &map, IndexStack &indexStack)
{
    for (size_t index = 0; index < component->componentCount(); ++index) {
        indexStack.push_back(index);
        auto c = component->component(index);
        recordVariableEquivalences(c, map, indexStack);
        generateEquivalenceMap(c, map, indexStack);
        indexStack.pop_back();
    }
}